

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O3

int xsdTestSuite(xmlNodePtr cur)

{
  xmlXPathContextPtr_conflict pxVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  xmlChar *pxVar6;
  xmlNodePtr cur_00;
  xmlNodePtr pxVar7;
  xmlNodePtr pxVar8;
  undefined8 *puVar9;
  undefined8 uVar10;
  xmlNodePtr pxVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  
  if ((verbose == '\x01') &&
     (pxVar6 = getString(cur,"string(documentation)"), pxVar6 != (xmlChar *)0x0)) {
    printf("Suite %s\n",pxVar6);
    (*_xmlFree)(pxVar6);
  }
  cur_00 = getNext(cur,"./testCase[1]");
  if (cur_00 != (xmlNodePtr)0x0) {
    do {
      if (0 < nb_entities) {
        lVar14 = 0;
        lVar16 = 0;
        do {
          if (*(long *)((long)testEntitiesName + lVar14) != 0) {
            (*_xmlFree)();
          }
          if (*(long *)((long)testEntitiesValue + lVar14) != 0) {
            (*_xmlFree)();
          }
          lVar16 = lVar16 + 1;
          lVar14 = lVar14 + 8;
        } while (lVar16 < nb_entities);
      }
      nb_entities = 0;
      testErrorsSize = 0;
      testErrors[0] = '\0';
      pxVar7 = getNext(cur_00,"./dir[1]");
      if (pxVar7 != (xmlNodePtr)0x0) {
        installDirs(pxVar7,(xmlChar *)0x0);
      }
      pxVar7 = getNext(cur_00,"./resource[1]");
      if (pxVar7 != (xmlNodePtr)0x0) {
        installResources(pxVar7,(xmlChar *)0x0);
      }
      pxVar7 = getNext(cur_00,"./correct[1]");
      if (pxVar7 == (xmlNodePtr)0x0) {
        pxVar7 = getNext(cur_00,"./incorrect[1]");
        if (pxVar7 != (xmlNodePtr)0x0) {
          pcVar15 = "./*";
          pxVar11 = pxVar7;
          pxVar8 = getNext(pxVar7,"./*");
          if (pxVar8 == (xmlNodePtr)0x0) {
            uVar10 = xmlGetLineNo(pxVar7);
            test_log("Failed to find test in correct line %ld\n",uVar10);
          }
          else {
            iVar2 = xmlMemUsed();
            extraMemoryFromResolver = 0;
            puVar9 = (undefined8 *)xmlBufferCreate();
            if (puVar9 == (undefined8 *)0x0) goto LAB_0010421d;
            xmlBufferSetAllocationScheme(puVar9,0);
            xmlNodeDump(puVar9,pxVar8->doc,pxVar8,0,0);
            uVar10 = xmlRelaxNGNewMemParserCtxt(*puVar9,*(undefined4 *)(puVar9 + 1));
            xmlRelaxNGSetParserErrors(uVar10,testErrorHandler);
            lVar14 = xmlRelaxNGParse(uVar10);
            xmlRelaxNGFreeParserCtxt(uVar10);
            if (lVar14 == 0) {
              xmlBufferFree(puVar9);
            }
            else {
              uVar10 = xmlGetLineNo(pxVar8);
              test_log("Failed to detect incorrect RNG line %ld\n",uVar10);
              xmlBufferFree(puVar9);
              xmlRelaxNGFree(lVar14);
            }
            xmlResetLastError();
            iVar3 = xmlMemUsed();
            if ((iVar2 < iVar3) && (extraMemoryFromResolver == 0)) {
              uVar10 = xmlGetLineNo(pxVar7);
              iVar3 = xmlMemUsed();
              uVar5 = iVar3 - iVar2;
              goto LAB_00104157;
            }
          }
        }
      }
      else {
        pcVar15 = "./*";
        pxVar11 = pxVar7;
        pxVar8 = getNext(pxVar7,"./*");
        if (pxVar8 == (xmlNodePtr)0x0) {
          xsdTestSuite_cold_4();
        }
        else {
          iVar2 = xmlMemUsed();
          extraMemoryFromResolver = 0;
          puVar9 = (undefined8 *)xmlBufferCreate();
          if (puVar9 == (undefined8 *)0x0) {
            xsdTestSuite_cold_3();
LAB_0010421d:
            xsdTestSuite_cold_5();
            pxVar1 = ctxtXPath;
            if (pcVar15 != (char *)0x0 && pxVar11->doc != (xmlDocPtr)0x0) {
              ctxtXPath->doc = pxVar11->doc;
              pxVar1->node = pxVar11;
              lVar14 = xmlXPathCompile(pcVar15);
              if (lVar14 == 0) {
                fprintf(_stderr,"Failed to compile %s\n",pcVar15);
                return 0;
              }
              piVar13 = (int *)xmlXPathCompiledEval(lVar14,ctxtXPath);
              xmlXPathFreeCompExpr(lVar14);
              if (piVar13 != (int *)0x0) {
                if (*piVar13 == 4) {
                  iVar2 = (int)*(undefined8 *)(piVar13 + 8);
                  piVar13[8] = 0;
                  piVar13[9] = 0;
                }
                else {
                  iVar2 = 0;
                }
                xmlXPathFreeObject(piVar13);
                return iVar2;
              }
            }
            return 0;
          }
          xmlBufferSetAllocationScheme(puVar9,0);
          xmlNodeDump(puVar9,pxVar8->doc,pxVar8,0,0);
          uVar10 = xmlRelaxNGNewMemParserCtxt(*puVar9,*(undefined4 *)(puVar9 + 1));
          xmlRelaxNGSetParserErrors(uVar10,testErrorHandler,testErrorHandler,uVar10);
          lVar14 = xmlRelaxNGParse(uVar10);
          xmlRelaxNGFreeParserCtxt(uVar10);
          if (extraMemoryFromResolver != 0) {
            iVar2 = 0;
          }
          if (lVar14 == 0) {
            uVar10 = xmlGetLineNo(pxVar8);
            test_log("Failed to parse RNGtest line %ld\n",uVar10);
            nb_errors = nb_errors + 1;
            xmlBufferFree(puVar9);
          }
          else {
            for (pxVar11 = getNext(pxVar7,"following-sibling::valid[1]"); pxVar11 != (xmlNodePtr)0x0
                ; pxVar11 = getNext(pxVar11,"following-sibling::valid[1]")) {
              lVar16 = xmlGetProp(pxVar11,"dtd");
              pxVar8 = getNext(pxVar11,"./*");
              if (pxVar8 == (xmlNodePtr)0x0) {
                xsdTestSuite_cold_1();
              }
              else {
                xmlBufferEmpty(puVar9);
                if (lVar16 != 0) {
                  xmlBufferAdd(puVar9,lVar16,0xffffffff);
                }
                xmlNodeDump(puVar9,pxVar8->doc,pxVar8,0,0);
                iVar3 = xmlMemUsed();
                extraMemoryFromResolver = 0;
                lVar12 = xmlReadMemory(*puVar9,*(undefined4 *)(puVar9 + 1),"test");
                if (lVar12 == 0) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  test_log("Failed to parse valid instance line %ld\n",uVar10);
                  nb_errors = nb_errors + 1;
                }
                else {
                  nb_tests = nb_tests + 1;
                  uVar10 = xmlRelaxNGNewValidCtxt(lVar14);
                  xmlRelaxNGSetValidErrors(uVar10,testErrorHandler);
                  iVar4 = xmlRelaxNGValidateDoc(uVar10,lVar12);
                  xmlRelaxNGFreeValidCtxt(uVar10);
                  pcVar15 = "Failed to validate valid instance line %ld\n";
                  if ((0 < iVar4) ||
                     (pcVar15 = "Internal error validating instance line %ld\n", iVar4 < 0)) {
                    uVar10 = xmlGetLineNo(pxVar11);
                    test_log(pcVar15,uVar10);
                    nb_errors = nb_errors + 1;
                  }
                  xmlFreeDoc(lVar12);
                }
                xmlResetLastError();
                iVar4 = xmlMemUsed();
                if ((iVar3 != iVar4) && (extraMemoryFromResolver == 0)) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  iVar4 = xmlMemUsed();
                  test_log("Validation of instance line %ld leaked %d\n",uVar10,
                           (ulong)(uint)(iVar4 - iVar3));
                  xmlMemoryDump();
                  nb_leaks = nb_leaks + 1;
                }
              }
              if (lVar16 != 0) {
                (*_xmlFree)(lVar16);
              }
            }
            for (pxVar11 = getNext(pxVar7,"following-sibling::invalid[1]");
                pxVar11 != (xmlNodePtr)0x0;
                pxVar11 = getNext(pxVar11,"following-sibling::invalid[1]")) {
              pxVar8 = getNext(pxVar11,"./*");
              if (pxVar8 == (xmlNodePtr)0x0) {
                xsdTestSuite_cold_2();
              }
              else {
                xmlBufferEmpty(puVar9);
                xmlNodeDump(puVar9,pxVar8->doc,pxVar8,0,0);
                iVar3 = xmlMemUsed();
                extraMemoryFromResolver = 0;
                lVar16 = xmlReadMemory(*puVar9,*(undefined4 *)(puVar9 + 1),"test");
                if (lVar16 == 0) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  test_log("Failed to parse valid instance line %ld\n",uVar10);
                  nb_errors = nb_errors + 1;
                }
                else {
                  nb_tests = nb_tests + 1;
                  uVar10 = xmlRelaxNGNewValidCtxt(lVar14);
                  xmlRelaxNGSetValidErrors(uVar10,testErrorHandler);
                  iVar4 = xmlRelaxNGValidateDoc(uVar10,lVar16);
                  xmlRelaxNGFreeValidCtxt(uVar10);
                  pcVar15 = "Failed to detect invalid instance line %ld\n";
                  if ((iVar4 == 0) ||
                     (pcVar15 = "Internal error validating instance line %ld\n", iVar4 < 0)) {
                    uVar10 = xmlGetLineNo(pxVar11);
                    test_log(pcVar15,uVar10);
                    nb_errors = nb_errors + 1;
                  }
                  xmlFreeDoc(lVar16);
                }
                xmlResetLastError();
                iVar4 = xmlMemUsed();
                if ((iVar3 != iVar4) && (extraMemoryFromResolver == 0)) {
                  uVar10 = xmlGetLineNo(pxVar11);
                  iVar4 = xmlMemUsed();
                  test_log("Validation of instance line %ld leaked %d\n",uVar10,
                           (ulong)(uint)(iVar4 - iVar3));
                  xmlMemoryDump();
                  nb_leaks = nb_leaks + 1;
                }
              }
            }
            xmlBufferFree(puVar9);
            xmlRelaxNGFree(lVar14);
          }
          xmlResetLastError();
          iVar3 = xmlMemUsed();
          if (iVar2 != 0 && iVar2 != iVar3) {
            uVar10 = xmlGetLineNo(pxVar7);
            iVar3 = xmlMemUsed();
            uVar5 = iVar3 - iVar2;
LAB_00104157:
            test_log("Validation of tests starting line %ld leaked %d\n",uVar10,(ulong)uVar5);
            nb_leaks = nb_leaks + 1;
          }
        }
      }
      cur_00 = getNext(cur_00,"following-sibling::testCase[1]");
    } while (cur_00 != (xmlNodePtr)0x0);
    cur_00 = (xmlNodePtr)0x0;
  }
  return (int)cur_00;
}

Assistant:

static int
xsdTestSuite(xmlNodePtr cur) {
    if (verbose) {
	xmlChar *doc = getString(cur, "string(documentation)");

	if (doc != NULL) {
	    printf("Suite %s\n", doc);
	    xmlFree(doc);
	}
    }
    cur = getNext(cur, "./testCase[1]");
    while (cur != NULL) {
        xsdTestCase(cur);
	cur = getNext(cur, "following-sibling::testCase[1]");
    }

    return(0);
}